

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O2

int Imf_3_4::getChunkOffsetTableSize(Header *header)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  int *piVar4;
  ArgExc *this;
  
  bVar1 = Header::hasType(header);
  if (bVar1) {
    psVar3 = Header::type_abi_cxx11_(header);
    bVar1 = isSupportedType(psVar3);
    if (!bVar1) {
      bVar1 = Header::hasChunkCount(header);
      if (bVar1) {
        piVar4 = Header::chunkCount(header);
        return *piVar4;
      }
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this,"unsupported header type to get chunk offset table size");
      __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
  }
  psVar3 = Header::type_abi_cxx11_(header);
  bVar1 = isTiled(psVar3);
  if (bVar1) {
    iVar2 = getTiledChunkOffsetTableSize(header);
    return iVar2;
  }
  iVar2 = getScanlineChunkOffsetTableSize(header);
  return iVar2;
}

Assistant:

int
getChunkOffsetTableSize (const Header& header)
{
    //
    // if there is a type in the header which indicates the part is not a currently supported type,
    // use the chunkCount attribute
    //

    if (header.hasType () && !isSupportedType (header.type ()))
    {
        if (header.hasChunkCount ()) { return header.chunkCount (); }
        else
        {
            throw IEX_NAMESPACE::ArgExc ("unsupported header type to "
                                         "get chunk offset table size");
        }
    }

    //
    // part is a known type - ignore the header attribute and compute the chunk size from the header
    //
    if (isTiled (header.type ()) == false)
        return getScanlineChunkOffsetTableSize (header);
    else
        return getTiledChunkOffsetTableSize (header);
}